

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

void setcharorrange(uchar **pp,uchar *charset)

{
  char_class cVar1;
  char_class cVar2;
  byte *pbVar3;
  byte c;
  byte c_00;
  
  pbVar3 = *pp;
  *pp = pbVar3 + 1;
  c_00 = *pbVar3;
  charset[c_00] = '\x01';
  if ((((byte)(c_00 - 0x30) < 10) || ((byte)((c_00 & 0xdf) + 0xbf) < 0x1a)) && (pbVar3[1] == 0x2d))
  {
    cVar1 = charclass(c_00);
    c = pbVar3[2];
    if (c == 0x5c) {
      c = pbVar3[3];
      pbVar3 = pbVar3 + 4;
    }
    else {
      pbVar3 = pbVar3 + 3;
    }
    if ((c_00 <= c) && (cVar2 = charclass(c), cVar2 == cVar1)) {
      while (c_00 = c_00 + 1, (byte)(c_00 - c) != '\x01') {
        cVar2 = charclass(c_00);
        if (cVar2 == cVar1) {
          charset[c_00] = '\x01';
        }
      }
      *pp = pbVar3;
    }
  }
  return;
}

Assistant:

static void setcharorrange(unsigned char **pp, unsigned char *charset)
{
  unsigned char *p = (*pp)++;
  unsigned char c = *p++;

  charset[c] = 1;
  if(ISALNUM(c) && *p++ == '-') {
    char_class cc = charclass(c);
    unsigned char endrange = *p++;

    if(endrange == '\\')
      endrange = *p++;
    if(endrange >= c && charclass(endrange) == cc) {
      while(c++ != endrange)
        if(charclass(c) == cc)  /* Chars in class may be not consecutive. */
          charset[c] = 1;
      *pp = p;
    }
  }
}